

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperSuper.c
# Opt level: O2

void Map_LibraryPrintSupergate(Map_Super_t *pGate)

{
  printf("%5d : ",(ulong)(uint)pGate->nUsed);
  printf("%5d   ",(ulong)(uint)pGate->Num);
  printf("A = %5.2f   ",(double)pGate->Area);
  printf("D = %5.2f/%5.2f/%5.2f   ",(double)(pGate->tDelayMax).Rise,(double)(pGate->tDelayMax).Fall,
         (double)(pGate->tDelayMax).Worst);
  printf("%s",pGate->pFormula);
  putchar(10);
  return;
}

Assistant:

void Map_LibraryPrintSupergate( Map_Super_t * pGate )
{
    printf( "%5d : ",  pGate->nUsed );
    printf( "%5d   ",  pGate->Num );
    printf( "A = %5.2f   ",  pGate->Area );
    printf( "D = %5.2f/%5.2f/%5.2f   ", pGate->tDelayMax.Rise, pGate->tDelayMax.Fall, pGate->tDelayMax.Worst );
    printf( "%s",    pGate->pFormula );
    printf( "\n" );
}